

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_add_core(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  REF_GLOB *pRVar6;
  REF_INT *pRVar7;
  REF_DBL *pRVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  if (global < 0) {
    pcVar14 = "invalid global node";
    uVar5 = 3;
    uVar10 = 0x11f;
    uVar13 = 3;
    goto LAB_00150fd1;
  }
  if (ref_node->blank != -1) goto LAB_00150f14;
  iVar4 = ref_node->max;
  lVar15 = (long)iVar4;
  iVar9 = 5000;
  if (5000 < (int)((double)iVar4 * 1.5)) {
    iVar9 = (int)((double)iVar4 * 1.5);
  }
  ref_node->max = iVar9 + iVar4;
  fflush(_stdout);
  pRVar6 = ref_node->global;
  if (0 < (long)ref_node->max) {
    pRVar6 = (REF_GLOB *)realloc(pRVar6,(long)ref_node->max << 3);
    ref_node->global = pRVar6;
  }
  auVar3 = _DAT_00200060;
  auVar2 = _DAT_00200050;
  if (pRVar6 == (REF_GLOB *)0x0) {
    pcVar14 = "realloc ref_node->global NULL";
    uVar10 = 0x125;
LAB_00151241:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10,
           "ref_node_add_core",pcVar14);
    uVar13 = (ulong)ref_node->max;
LAB_0015124e:
    lVar15 = uVar13 * 8;
  }
  else {
    iVar9 = ref_node->max;
    if (iVar4 < iVar9) {
      lVar11 = iVar9 - lVar15;
      lVar12 = lVar11 + -1;
      auVar16._8_4_ = (int)lVar12;
      auVar16._0_8_ = lVar12;
      auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
      lVar12 = -4 - lVar15;
      uVar13 = 0;
      auVar16 = auVar16 ^ _DAT_00200060;
      do {
        auVar18._8_4_ = (int)uVar13;
        auVar18._0_8_ = uVar13;
        auVar18._12_4_ = (int)(uVar13 >> 0x20);
        auVar18 = (auVar18 | auVar2) ^ auVar3;
        bVar1 = auVar16._0_4_ < auVar18._0_4_;
        iVar17 = auVar16._4_4_;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(iVar17 < iVar19 || iVar19 == iVar17 && bVar1) & 1)) {
          pRVar6[lVar15 + uVar13] = lVar12 + 1;
        }
        if (iVar17 >= iVar19 && (iVar19 != iVar17 || !bVar1)) {
          pRVar6[lVar15 + uVar13 + 1] = lVar12;
        }
        uVar13 = uVar13 + 2;
        lVar12 = lVar12 + -2;
      } while ((lVar11 + 1U & 0xfffffffffffffffe) != uVar13);
    }
    pRVar6[(long)iVar9 + -1] = -1;
    ref_node->blank = -2 - iVar4;
    fflush(_stdout);
    pRVar6 = ref_node->sorted_global;
    if (0 < (long)ref_node->max) {
      pRVar6 = (REF_GLOB *)realloc(pRVar6,(long)ref_node->max << 3);
      ref_node->sorted_global = pRVar6;
    }
    if (pRVar6 == (REF_GLOB *)0x0) {
      pcVar14 = "realloc ref_node->sorted_global NULL";
      uVar10 = 299;
      goto LAB_00151241;
    }
    fflush(_stdout);
    pRVar7 = ref_node->sorted_local;
    if (0 < (long)ref_node->max) {
      pRVar7 = (REF_INT *)realloc(pRVar7,(long)ref_node->max << 2);
      ref_node->sorted_local = pRVar7;
    }
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar14 = "realloc ref_node->sorted_local NULL";
      uVar10 = 300;
LAB_001512ce:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10
             ,"ref_node_add_core",pcVar14);
      uVar13 = (ulong)ref_node->max;
      lVar15 = uVar13 * 4;
      uVar10 = 4;
      goto LAB_001512ef;
    }
    fflush(_stdout);
    pRVar7 = ref_node->part;
    if (0 < (long)ref_node->max) {
      pRVar7 = (REF_INT *)realloc(pRVar7,(long)ref_node->max << 2);
      ref_node->part = pRVar7;
    }
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar14 = "realloc ref_node->part NULL";
      uVar10 = 0x12e;
      goto LAB_001512ce;
    }
    fflush(_stdout);
    pRVar7 = ref_node->age;
    if (0 < (long)ref_node->max) {
      pRVar7 = (REF_INT *)realloc(pRVar7,(long)ref_node->max << 2);
      ref_node->age = pRVar7;
    }
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar14 = "realloc ref_node->age NULL";
      uVar10 = 0x12f;
      goto LAB_001512ce;
    }
    fflush(_stdout);
    if ((long)ref_node->max == 0) {
      pRVar8 = ref_node->real;
    }
    else {
      pRVar8 = (REF_DBL *)realloc(ref_node->real,(long)ref_node->max * 0x78);
      ref_node->real = pRVar8;
    }
    if (pRVar8 != (REF_DBL *)0x0) {
      if (ref_node->naux < 1) {
LAB_00150f14:
        iVar4 = -2 - ref_node->blank;
        *node = iVar4;
        ref_node->blank = (REF_INT)ref_node->global[iVar4];
        iVar4 = *node;
        ref_node->global[iVar4] = global;
        ref_node->part[iVar4] = ref_node->ref_mpi->id;
        ref_node->age[*node] = 0;
        uVar5 = ref_node_metric_form(ref_node,*node,1.0,0.0,0.0,1.0,0.0,1.0);
        if (uVar5 == 0) {
          ref_node->n = ref_node->n + 1;
          return 0;
        }
        pcVar14 = "set ident";
        uVar10 = 0x145;
        uVar13 = (ulong)uVar5;
LAB_00150fd1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar10,"ref_node_add_core",uVar13,pcVar14);
        return uVar5;
      }
      fflush(_stdout);
      lVar15 = (long)ref_node->max * (long)ref_node->naux;
      pRVar8 = ref_node->aux;
      if (lVar15 != 0) {
        pRVar8 = (REF_DBL *)realloc(pRVar8,lVar15 * 8);
        ref_node->aux = pRVar8;
      }
      if (pRVar8 != (REF_DBL *)0x0) goto LAB_00150f14;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x13a,
             "ref_node_add_core","realloc ref_node->aux NULL");
      uVar13 = (long)ref_node->max * (long)ref_node->naux;
      goto LAB_0015124e;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x134,
           "ref_node_add_core","realloc ref_node->real NULL");
    uVar13 = (long)ref_node->max * 0xf;
    lVar15 = (long)ref_node->max * 0x78;
  }
  uVar10 = 8;
LAB_001512ef:
  printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar13 & 0xffffffff,uVar13,
         uVar10,lVar15);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_node_add_core(REF_NODE ref_node, REF_GLOB global,
                                            REF_INT *node) {
  REF_INT orig, chunk, extra;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  if (REF_EMPTY == ref_node->blank) {
    orig = ref_node_max(ref_node);
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_node->max = orig + chunk;
    ref_realloc(ref_node->global, ref_node_max(ref_node), REF_GLOB);
    for (extra = orig; extra < ref_node_max(ref_node); extra++)
      ref_node->global[extra] = index2next(extra + 1);
    ref_node->global[ref_node_max(ref_node) - 1] = REF_EMPTY;
    ref_node->blank = index2next(orig);

    ref_realloc(ref_node->sorted_global, ref_node_max(ref_node), REF_GLOB);
    ref_realloc(ref_node->sorted_local, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->part, ref_node_max(ref_node), REF_INT);
    ref_realloc(ref_node->age, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->real,
                ((unsigned long)REF_NODE_REAL_PER *
                 (unsigned long)ref_node_max(ref_node)),
                REF_DBL);

    if (ref_node_naux(ref_node) > 0)
      ref_realloc(ref_node->aux,
                  ((unsigned long)ref_node_naux(ref_node) *
                   (unsigned long)ref_node_max(ref_node)),
                  REF_DBL);
  }

  *node = next2index(ref_node->blank);
  ref_node->blank = (REF_INT)ref_node->global[*node];

  ref_node->global[*node] = global;
  ref_node->part[*node] =
      ref_mpi_rank(ref_node_mpi(ref_node)); /*local default*/
  ref_node->age[*node] = 0;                 /* default new born */

  RSS(ref_node_metric_form(ref_node, *node, 1, 0, 0, 1, 0, 1), "set ident");

  (ref_node->n)++;
  return REF_SUCCESS;
}